

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O0

EstimatorStats *
GetErrorStatistics(EstimatorStats *__return_storage_ptr__,
                  vector<Estimates,_std::allocator<Estimates>_> *algo_estimates,Count true_count)

{
  size_type sVar1;
  reference pvVar2;
  iterator iVar3;
  iterator iVar4;
  reference pdVar5;
  reference pEVar6;
  iterator __first;
  iterator __last;
  vector<Estimates,_std::allocator<Estimates>_> *pvVar7;
  double extraout_XMM0_Qa;
  double dVar8;
  __normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_> local_180;
  double local_178;
  double query_complexity_percentage;
  __normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_> local_168;
  __normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_> local_160;
  double local_158;
  double edges_seen_percentage;
  __normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_> local_148;
  __normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_> local_140;
  double local_138;
  double vertices_seen_percentage;
  double stdev_error_percentage;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_120;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_118;
  double local_110;
  double sq_sum;
  pointer local_100;
  double *local_f8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_f0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_e8;
  allocator<double> local_d9;
  undefined1 local_d8 [8];
  vector<double,_std::allocator<double>_> diff;
  double mean_error_percentage;
  double sum;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  double local_88;
  double max_error_percentage;
  double median_error_percentage;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  int local_54;
  int local_50;
  int middle_index;
  int i;
  allocator<double> local_39;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> algo_error_percentage_list;
  int no_of_repeats;
  Count true_count_local;
  vector<Estimates,_std::allocator<Estimates>_> *algo_estimates_local;
  
  sVar1 = std::vector<Estimates,_std::allocator<Estimates>_>::size(algo_estimates);
  algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar1;
  sVar1 = (size_type)
          algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,sVar1,&local_39);
  std::allocator<double>::~allocator(&local_39);
  for (local_50 = 0;
      local_50 <
      algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_50 = local_50 + 1) {
    pvVar7 = algo_estimates;
    std::vector<Estimates,_std::allocator<Estimates>_>::operator[](algo_estimates,(long)local_50);
    std::abs((int)pvVar7);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,(long)local_50);
    *pvVar2 = (extraout_XMM0_Qa * 100.0) / (double)true_count;
  }
  local_54 = algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ / 2;
  local_60._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_38);
  local_70._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_38);
  local_68 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator+(&local_70,(long)local_54);
  median_error_percentage =
       (double)std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)local_38);
  std::nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (local_60,local_68,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             median_error_percentage);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,(long)local_54);
  max_error_percentage = *pvVar2;
  iVar3 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_38);
  iVar4 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_38);
  local_90 = std::
             max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (iVar3._M_current,iVar4._M_current);
  pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_90);
  local_88 = *pdVar5;
  iVar3 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_38);
  iVar4 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_38);
  dVar8 = std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar3._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar4._M_current,0.0);
  diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(dVar8 / (double)algo_error_percentage_list.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_);
  sVar1 = (size_type)
          algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<double>::allocator(&local_d9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_d8,sVar1,&local_d9);
  std::allocator<double>::~allocator(&local_d9);
  local_e8._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_38);
  local_f0._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::end
                 ((vector<double,_std::allocator<double>_> *)local_38);
  local_f8 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_d8);
  local_100 = diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  sq_sum = (double)std::
                   transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,GetErrorStatistics(std::vector<Estimates,std::allocator<Estimates>>,long)::__0>
                             (local_e8,local_f0,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               )local_f8,
                              (anon_class_8_1_c324df8b)
                              diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
  local_118._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_d8);
  local_120._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::end
                 ((vector<double,_std::allocator<double>_> *)local_d8);
  stdev_error_percentage =
       (double)std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)local_d8);
  local_110 = std::
              inner_product<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                        (local_118,local_120,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )stdev_error_percentage,0.0);
  vertices_seen_percentage =
       sqrt(local_110 /
            (double)algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  local_148._M_current =
       (Estimates *)std::vector<Estimates,_std::allocator<Estimates>_>::begin(algo_estimates);
  edges_seen_percentage =
       (double)std::vector<Estimates,_std::allocator<Estimates>_>::end(algo_estimates);
  local_140 = std::
              max_element<__gnu_cxx::__normal_iterator<Estimates*,std::vector<Estimates,std::allocator<Estimates>>>,bool(*)(Estimates,Estimates)>
                        (local_148,
                         (__normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_>
                          )edges_seen_percentage,ComparatorByVerticesSeen);
  pEVar6 = __gnu_cxx::
           __normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_>::
           operator*(&local_140);
  local_138 = pEVar6->fraction_of_vertices_seen;
  local_168._M_current =
       (Estimates *)std::vector<Estimates,_std::allocator<Estimates>_>::begin(algo_estimates);
  query_complexity_percentage =
       (double)std::vector<Estimates,_std::allocator<Estimates>_>::end(algo_estimates);
  local_160 = std::
              max_element<__gnu_cxx::__normal_iterator<Estimates*,std::vector<Estimates,std::allocator<Estimates>>>,bool(*)(Estimates,Estimates)>
                        (local_168,
                         (__normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_>
                          )query_complexity_percentage,ComparatorByEdgesSeen);
  pEVar6 = __gnu_cxx::
           __normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_>::
           operator*(&local_160);
  local_158 = pEVar6->fraction_of_edges_seen;
  __first = std::vector<Estimates,_std::allocator<Estimates>_>::begin(algo_estimates);
  __last = std::vector<Estimates,_std::allocator<Estimates>_>::end(algo_estimates);
  local_180 = std::
              max_element<__gnu_cxx::__normal_iterator<Estimates*,std::vector<Estimates,std::allocator<Estimates>>>,bool(*)(Estimates,Estimates)>
                        (__first._M_current,__last._M_current,ComparatorByEdgesSeen);
  pEVar6 = __gnu_cxx::
           __normal_iterator<Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_>::
           operator*(&local_180);
  local_178 = pEVar6->query_complexity;
  __return_storage_ptr__->no_of_repeats =
       algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  __return_storage_ptr__->mean_error_percentage =
       (double)diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  __return_storage_ptr__->median_error_percentage = max_error_percentage;
  __return_storage_ptr__->stddev_error_percentage = vertices_seen_percentage;
  __return_storage_ptr__->max_error_percentage = local_88;
  __return_storage_ptr__->vertices_seen_max_percentage = local_138;
  __return_storage_ptr__->edges_seen_max_percentage = local_158;
  __return_storage_ptr__->query_complexity_max_percentage = local_178;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_d8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

EstimatorStats GetErrorStatistics(std::vector<Estimates> algo_estimates, Count true_count) {

    int no_of_repeats = (int) algo_estimates.size();

    // Populate the error percentage for each run
    std::vector<double> algo_error_percentage_list(no_of_repeats);
    // TODO consider using lambda function
    for (int i = 0; i < no_of_repeats; i++)
        algo_error_percentage_list[i] =
                std::abs(algo_estimates[i].estimate - true_count) * 100 / true_count;

    int middle_index = no_of_repeats / 2;
    std::nth_element(algo_error_percentage_list.begin(), algo_error_percentage_list.begin() + middle_index,
                     algo_error_percentage_list.end());
    double median_error_percentage = algo_error_percentage_list[middle_index];

    double max_error_percentage = *std::max_element(algo_error_percentage_list.begin(),
                                                    algo_error_percentage_list.end());

    double sum = std::accumulate(algo_error_percentage_list.begin(), algo_error_percentage_list.end(), 0.0);
    double mean_error_percentage = sum / no_of_repeats;

    std::vector<double> diff(no_of_repeats);
    std::transform(algo_error_percentage_list.begin(), algo_error_percentage_list.end(), diff.begin(),
                   [mean_error_percentage](double x) { return x - mean_error_percentage; });
    double sq_sum = std::inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
    double stdev_error_percentage = std::sqrt(sq_sum / no_of_repeats);


    // Maximum edges and vertices seen over all the runs
    double vertices_seen_percentage = (*std::max_element(algo_estimates.begin(),
                                                         algo_estimates.end(),
                                                         ComparatorByVerticesSeen)).fraction_of_vertices_seen;
    double edges_seen_percentage = (*std::max_element(algo_estimates.begin(),
                                                      algo_estimates.end(),
                                                      ComparatorByEdgesSeen)).fraction_of_edges_seen;

    double query_complexity_percentage = (*std::max_element(algo_estimates.begin(),
                                                      algo_estimates.end(),
                                                      ComparatorByEdgesSeen)).query_complexity;

    EstimatorStats est_stats = {no_of_repeats, mean_error_percentage, median_error_percentage,
                                stdev_error_percentage, max_error_percentage,
                                vertices_seen_percentage, edges_seen_percentage, query_complexity_percentage};
    return est_stats;
}